

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StrWriter_cpp.h
# Opt level: O3

StrWriter * __thiscall moira::StrWriter::operator<<(StrWriter *this,Cn cn)

{
  Syntax SVar1;
  char *pcVar2;
  long lVar3;
  char *pcVar4;
  char cVar5;
  uint uVar6;
  UInt u;
  
  SVar1 = this->style->syntax;
  u.raw._2_2_ = 0;
  u.raw._0_2_ = cn.raw;
  if (cn.raw < 8 || (cn.raw & 0xfff8) == 0x800) {
    if ((SVar1 | GNU) == GNU_MIT) {
      pcVar4 = this->ptr;
      this->ptr = pcVar4 + 1;
      *pcVar4 = '%';
    }
    uVar6 = SVar1 - MUSASHI;
    switch(cn.raw) {
    case 0:
      pcVar4 = "sfc";
      if (uVar6 < 0xfffffffe) {
        pcVar4 = "SFC";
      }
      cVar5 = *pcVar4;
      while (cVar5 != '\0') {
        pcVar4 = pcVar4 + 1;
        pcVar2 = this->ptr;
        this->ptr = pcVar2 + 1;
        *pcVar2 = cVar5;
        cVar5 = *pcVar4;
      }
      break;
    case 1:
      pcVar4 = "dfc";
      if (uVar6 < 0xfffffffe) {
        pcVar4 = "DFC";
      }
      cVar5 = *pcVar4;
      while (cVar5 != '\0') {
        pcVar4 = pcVar4 + 1;
        pcVar2 = this->ptr;
        this->ptr = pcVar2 + 1;
        *pcVar2 = cVar5;
        cVar5 = *pcVar4;
      }
      break;
    case 2:
      pcVar4 = "cacr";
      if (uVar6 < 0xfffffffe) {
        pcVar4 = "CACR";
      }
      cVar5 = *pcVar4;
      while (cVar5 != '\0') {
        pcVar4 = pcVar4 + 1;
        pcVar2 = this->ptr;
        this->ptr = pcVar2 + 1;
        *pcVar2 = cVar5;
        cVar5 = *pcVar4;
      }
      break;
    case 3:
      pcVar4 = "tc";
      if (uVar6 < 0xfffffffe) {
        pcVar4 = "TC";
      }
      cVar5 = *pcVar4;
      while (cVar5 != '\0') {
        pcVar4 = pcVar4 + 1;
        pcVar2 = this->ptr;
        this->ptr = pcVar2 + 1;
        *pcVar2 = cVar5;
        cVar5 = *pcVar4;
      }
      break;
    case 4:
      pcVar4 = "itt0";
      if (uVar6 < 0xfffffffe) {
        pcVar4 = "ITT0";
      }
      cVar5 = *pcVar4;
      while (cVar5 != '\0') {
        pcVar4 = pcVar4 + 1;
        pcVar2 = this->ptr;
        this->ptr = pcVar2 + 1;
        *pcVar2 = cVar5;
        cVar5 = *pcVar4;
      }
      break;
    case 5:
      pcVar4 = "itt1";
      if (uVar6 < 0xfffffffe) {
        pcVar4 = "ITT1";
      }
      cVar5 = *pcVar4;
      while (cVar5 != '\0') {
        pcVar4 = pcVar4 + 1;
        pcVar2 = this->ptr;
        this->ptr = pcVar2 + 1;
        *pcVar2 = cVar5;
        cVar5 = *pcVar4;
      }
      break;
    case 6:
      pcVar4 = "dtt0";
      if (uVar6 < 0xfffffffe) {
        pcVar4 = "DTT0";
      }
      cVar5 = *pcVar4;
      while (cVar5 != '\0') {
        pcVar4 = pcVar4 + 1;
        pcVar2 = this->ptr;
        this->ptr = pcVar2 + 1;
        *pcVar2 = cVar5;
        cVar5 = *pcVar4;
      }
      break;
    case 7:
      pcVar4 = "dtt1";
      if (uVar6 < 0xfffffffe) {
        pcVar4 = "DTT1";
      }
      cVar5 = *pcVar4;
      while (cVar5 != '\0') {
        pcVar4 = pcVar4 + 1;
        pcVar2 = this->ptr;
        this->ptr = pcVar2 + 1;
        *pcVar2 = cVar5;
        cVar5 = *pcVar4;
      }
      break;
    case 8:
      pcVar4 = "buscr";
      if (uVar6 < 0xfffffffe) {
        pcVar4 = "BUSCR";
      }
      cVar5 = *pcVar4;
      while (cVar5 != '\0') {
        pcVar4 = pcVar4 + 1;
        pcVar2 = this->ptr;
        this->ptr = pcVar2 + 1;
        *pcVar2 = cVar5;
        cVar5 = *pcVar4;
      }
      break;
    default:
      switch(u.raw) {
      case 0x800:
        pcVar4 = "usp";
        if (uVar6 < 0xfffffffe) {
          pcVar4 = "USP";
        }
        cVar5 = *pcVar4;
        while (cVar5 != '\0') {
          pcVar4 = pcVar4 + 1;
          pcVar2 = this->ptr;
          this->ptr = pcVar2 + 1;
          *pcVar2 = cVar5;
          cVar5 = *pcVar4;
        }
        break;
      case 0x801:
        pcVar4 = "vbr";
        if (uVar6 < 0xfffffffe) {
          pcVar4 = "VBR";
        }
        cVar5 = *pcVar4;
        while (cVar5 != '\0') {
          pcVar4 = pcVar4 + 1;
          pcVar2 = this->ptr;
          this->ptr = pcVar2 + 1;
          *pcVar2 = cVar5;
          cVar5 = *pcVar4;
        }
        break;
      case 0x802:
        pcVar4 = "caar";
        if (uVar6 < 0xfffffffe) {
          pcVar4 = "CAAR";
        }
        cVar5 = *pcVar4;
        while (cVar5 != '\0') {
          pcVar4 = pcVar4 + 1;
          pcVar2 = this->ptr;
          this->ptr = pcVar2 + 1;
          *pcVar2 = cVar5;
          cVar5 = *pcVar4;
        }
        break;
      case 0x803:
        pcVar4 = "msp";
        if (uVar6 < 0xfffffffe) {
          pcVar4 = "MSP";
        }
        cVar5 = *pcVar4;
        while (cVar5 != '\0') {
          pcVar4 = pcVar4 + 1;
          pcVar2 = this->ptr;
          this->ptr = pcVar2 + 1;
          *pcVar2 = cVar5;
          cVar5 = *pcVar4;
        }
        break;
      case 0x804:
        pcVar4 = "isp";
        if (uVar6 < 0xfffffffe) {
          pcVar4 = "ISP";
        }
        cVar5 = *pcVar4;
        while (cVar5 != '\0') {
          pcVar4 = pcVar4 + 1;
          pcVar2 = this->ptr;
          this->ptr = pcVar2 + 1;
          *pcVar2 = cVar5;
          cVar5 = *pcVar4;
        }
        break;
      case 0x805:
        pcVar4 = "mmusr";
        if (uVar6 < 0xfffffffe) {
          pcVar4 = "MMUSR";
        }
        cVar5 = *pcVar4;
        while (cVar5 != '\0') {
          pcVar4 = pcVar4 + 1;
          pcVar2 = this->ptr;
          this->ptr = pcVar2 + 1;
          *pcVar2 = cVar5;
          cVar5 = *pcVar4;
        }
        break;
      case 0x806:
        pcVar4 = "urp";
        if (uVar6 < 0xfffffffe) {
          pcVar4 = "URP";
        }
        cVar5 = *pcVar4;
        while (cVar5 != '\0') {
          pcVar4 = pcVar4 + 1;
          pcVar2 = this->ptr;
          this->ptr = pcVar2 + 1;
          *pcVar2 = cVar5;
          cVar5 = *pcVar4;
        }
        break;
      case 0x807:
        pcVar4 = "srp";
        if (uVar6 < 0xfffffffe) {
          pcVar4 = "SRP";
        }
        cVar5 = *pcVar4;
        while (cVar5 != '\0') {
          pcVar4 = pcVar4 + 1;
          pcVar2 = this->ptr;
          this->ptr = pcVar2 + 1;
          *pcVar2 = cVar5;
          cVar5 = *pcVar4;
        }
      }
    }
  }
  else if (SVar1 - GNU < 3) {
    operator<<(this,u);
  }
  else {
    cVar5 = 'I';
    lVar3 = 1;
    do {
      pcVar4 = this->ptr;
      this->ptr = pcVar4 + 1;
      *pcVar4 = cVar5;
      cVar5 = "INVALID"[lVar3];
      lVar3 = lVar3 + 1;
    } while (lVar3 != 8);
  }
  return this;
}

Assistant:

StrWriter&
StrWriter::operator<<(Cn cn)
{
    bool valid = cn.raw <= 0x007 || (cn.raw >= 0x800 && cn.raw <= 0x807);
    bool upper = style.syntax != Syntax::GNU && style.syntax != Syntax::GNU_MIT;

    if (valid) {

        if (style.syntax == Syntax::GNU_MIT || style.syntax == Syntax::MOIRA_MIT) {
            *ptr++ = '%';
        }

        switch (cn.raw) {

            case 0x000: *this << (upper ? "SFC"   : "sfc");   break;
            case 0x001: *this << (upper ? "DFC"   : "dfc");   break;
            case 0x002: *this << (upper ? "CACR"  : "cacr");  break;
            case 0x003: *this << (upper ? "TC"    : "tc");    break;
            case 0x004: *this << (upper ? "ITT0"  : "itt0");  break;
            case 0x005: *this << (upper ? "ITT1"  : "itt1");  break;
            case 0x006: *this << (upper ? "DTT0"  : "dtt0");  break;
            case 0x007: *this << (upper ? "DTT1"  : "dtt1");  break;
            case 0x008: *this << (upper ? "BUSCR" : "buscr"); break;
            case 0x800: *this << (upper ? "USP"   : "usp");   break;
            case 0x801: *this << (upper ? "VBR"   : "vbr");   break;
            case 0x802: *this << (upper ? "CAAR"  : "caar");  break;
            case 0x803: *this << (upper ? "MSP"   : "msp");   break;
            case 0x804: *this << (upper ? "ISP"   : "isp");   break;
            case 0x805: *this << (upper ? "MMUSR" : "mmusr"); break;
            case 0x806: *this << (upper ? "URP"   : "urp");   break;
            case 0x807: *this << (upper ? "SRP"   : "srp");   break;
            case 0x808: *this << (upper ? "PCR"   : "pcr");   break;
        }

    } else {

        if (style.syntax == Syntax::MUSASHI || style.syntax == Syntax::GNU || style.syntax == Syntax::GNU_MIT) {
            *this << UInt(cn.raw);
        } else {
            *this << "INVALID";
        }
    }

    return *this;
}